

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O3

Vector3D * __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::
StartVectorOfStructs<Geometry::Vector3D,flatbuffers::Offset>
          (FlatBufferBuilderImpl<false> *this,size_t vector_size)

{
  uint *puVar1;
  size_t len;
  Vector3D *pVVar2;
  
  StartVector<flatbuffers::Offset,unsigned_int>(this,vector_size,0xc,4);
  len = vector_size * 0xc;
  if (len == 0) {
    pVVar2 = (Vector3D *)(this->buf_).cur_;
  }
  else {
    vector_downward<unsigned_int>::ensure_space(&this->buf_,len);
    pVVar2 = (Vector3D *)((this->buf_).cur_ + vector_size * -0xc);
    (this->buf_).cur_ = (uint8_t *)pVVar2;
    puVar1 = &(this->buf_).size_;
    *puVar1 = *puVar1 + (int)len;
  }
  return pVVar2;
}

Assistant:

T *StartVectorOfStructs(size_t vector_size) {
    StartVector<OffsetT>(vector_size, sizeof(T), AlignOf<T>());
    return reinterpret_cast<T *>(buf_.make_space(vector_size * sizeof(T)));
  }